

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

sexp_conflict check_exception(sexp_conflict ctx,sexp_conflict res)

{
  sexp psVar1;
  undefined8 uVar2;
  sexp_conflict psVar3;
  sexp_conflict advise;
  sexp_conflict err;
  sexp_conflict sym;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_78;
  local_70 = (sexp_conflict)0x43e;
  local_78 = (sexp_conflict)0x43e;
  local_68 = (sexp_conflict)0x43e;
  if ((((ulong)res & 3) == 0 && res != (sexp_conflict)0x0) && (res->tag == 0x13)) {
    local_58.var = &local_70;
    local_28.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    local_38.next = &local_28;
    local_38.var = &local_68;
    local_48.next = &local_38;
    local_48.var = &local_60;
    (ctx->value).context.saves = &local_48;
    local_60 = res;
    uVar2 = sexp_env_ref(ctx,(ctx->value).type.cpl,
                         (((ctx->value).type.setters)->value).context.mark_stack[3].prev,0x3e);
    local_70 = (sexp_conflict)sexp_parameter_ref(ctx,uVar2);
    if ((((ulong)local_70 & 3) != 0) || (local_70->tag != 0x11)) {
      local_70 = (sexp_conflict)sexp_make_output_port(ctx,_stderr,0x3e);
    }
    sexp_print_exception_op(ctx,0,2,res,local_70);
    sexp_print_exception_stack_trace_op(ctx,0,2,res,local_70);
    psVar1 = (((ctx->value).type.setters)->value).context.dl;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x17)) {
      local_78 = (sexp_conflict)
                 sexp_eval_string(ctx,"(load-module \'(chibi repl))",0xffffffffffffffff);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 10)) {
        local_78 = (local_78->value).type.slots;
        if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x17)) {
          local_68 = (sexp_conflict)sexp_intern(ctx,"repl-advise-exception",0xffffffffffffffff);
          psVar3 = (sexp_conflict)sexp_env_ref(ctx,local_78,local_68,0x3e);
          local_78 = psVar3;
          if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x14)) {
            local_60 = (sexp_conflict)sexp_list2(ctx,res,local_70);
            sexp_apply(ctx,psVar3,local_60);
          }
        }
      }
    }
    (ctx->value).context.saves = local_58.next;
    exit(0x46);
  }
  return res;
}

Assistant:

static sexp check_exception (sexp ctx, sexp res) {
  sexp_gc_var4(err, advise, sym, tmp);
  if (res && sexp_exceptionp(res)) {
    sexp_gc_preserve4(ctx, err, advise, sym, tmp);
    tmp = res;
    err = sexp_current_error_port(ctx);
    if (! sexp_oportp(err))
      err = sexp_make_output_port(ctx, stderr, SEXP_FALSE);
    sexp_print_exception(ctx, res, err);
    sexp_print_exception_stack_trace(ctx, res, err);
#if SEXP_USE_MAIN_ERROR_ADVISE
    if (sexp_envp(sexp_global(ctx, SEXP_G_META_ENV))) {
      advise = sexp_eval_string(ctx, sexp_advice_environment, -1, sexp_global(ctx, SEXP_G_META_ENV));
      if (sexp_vectorp(advise)) {
        advise = sexp_vector_ref(advise, SEXP_ONE);
        if (sexp_envp(advise)) {
          sym = sexp_intern(ctx, "repl-advise-exception", -1);
          advise = sexp_env_ref(ctx, advise, sym, SEXP_FALSE);
          if (sexp_procedurep(advise))
            sexp_apply(ctx, advise, tmp=sexp_list2(ctx, res, err));
        }
      }
    }
#endif
    sexp_gc_release4(ctx);
    exit_failure();
  }
  return res;
}